

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O0

bool __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::open_stream_file_in_pool
          (basic_seq_coro_file<(coro_io::execution_type)1> *this,string_view filepath,openmode flags
          )

{
  ulong uVar1;
  bool *pbVar2;
  Try<int> *in_RDX;
  Try<int> result;
  Lazy<async_simple::Try<bool>_> coro_func;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
  *in_stack_00000130;
  function<int_()> *in_stack_00000150;
  Try<int> *lazy;
  undefined1 local_1;
  
  uVar1 = std::fstream::is_open();
  if ((uVar1 & 1) == 0) {
    lazy = in_RDX;
    post<coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::open_stream_file_in_pool(std::basic_string_view<char,std::char_traits<char>>,std::_Ios_Openmode)::_lambda()_1_>
              (in_stack_00000150,in_stack_00000130);
    async_simple::coro::syncAwait<async_simple::coro::Lazy<async_simple::Try<bool>>&>
              ((Lazy<async_simple::Try<bool>_> *)lazy);
    pbVar2 = async_simple::Try<bool>::value(in_RDX);
    local_1 = (bool)(*pbVar2 & 1);
    async_simple::Try<bool>::~Try((Try<int> *)0x1d52c0);
    async_simple::coro::Lazy<async_simple::Try<bool>_>::~Lazy
              ((Lazy<async_simple::Try<bool>_> *)0x1d52ca);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool open_stream_file_in_pool(std::string_view filepath,
                                std::ios::ios_base::openmode flags) {
    if (frw_seq_file_.is_open()) {
      return true;
    }
    auto coro_func = coro_io::post(
        [this, flags, filepath]() mutable {
          frw_seq_file_.open(filepath.data(), flags);
          if (!frw_seq_file_.is_open()) {
            std::cout << "line " << __LINE__ << " coro_file open failed "
                      << filepath << "\n";
            std::cerr << "Error: " << strerror(errno);
            return false;
          }
          return true;
        },
        &executor_wrapper_);
    auto result = async_simple::coro::syncAwait(coro_func);
    return result.value();
  }